

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_widget.c
# Opt level: O3

void menu_widget_layer_update(ugui_layer_t *layer,void *graphics_ctx,void *layer_ctx)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ugui_rect_t *puVar6;
  uint uVar7;
  undefined1 local_118 [8];
  char header [64];
  char title [64];
  char data [64];
  ugui_point_t local_38;
  ugui_size_t local_34;
  
  puVar6 = ugui_layer_get_bounds(layer);
  uVar1 = (**(code **)((long)layer_ctx + 0x30))(layer_ctx,*(undefined8 *)((long)layer_ctx + 0x58));
  iVar2 = (**(code **)((long)layer_ctx + 8))(layer_ctx,*(undefined8 *)((long)layer_ctx + 0x58));
  iVar3 = (**(code **)((long)layer_ctx + 0x10))(layer_ctx,*(undefined8 *)((long)layer_ctx + 0x58));
  iVar4 = (uint)puVar6->h - iVar2;
  uVar5 = iVar4 / iVar3;
  if ((int)uVar1 < (int)uVar5) {
    uVar5 = uVar1;
  }
  local_38 = (ugui_point_t)((uint)local_38.y << 0x10);
  local_34.h = (uint16_t)iVar3;
  local_34.w = puVar6->w;
  (**(code **)((long)layer_ctx + 0x38))(layer_ctx,local_118,(long)iVar4 % (long)iVar3 & 0xffffffff);
  (**(code **)((long)layer_ctx + 0x18))(graphics_ctx,puVar6,local_118);
  if (0 < (int)uVar5) {
    uVar7 = 0;
    uVar1 = 1;
    do {
      local_38.y = (short)uVar7 * (uint16_t)iVar3 + (short)iVar2;
      (**(code **)((long)layer_ctx + 0x40))
                (layer_ctx,*(int *)((long)layer_ctx + 0x54) + uVar7 & 0xffff,header + 0x38,
                 title + 0x38);
      (**(code **)((long)layer_ctx + 0x20))(graphics_ctx,&local_38,header + 0x38,title + 0x38);
      if (uVar7 + *(int *)((long)layer_ctx + 0x54) == *(int *)((long)layer_ctx + 0x50)) {
        ugui_graphics_inverse_rect((ugui_graphics_t *)graphics_ctx,local_38,local_34);
      }
      uVar7 = uVar1 & 0xff;
      uVar1 = uVar7 + 1;
    } while (uVar7 < uVar5);
  }
  return;
}

Assistant:

static void menu_widget_layer_update(ugui_layer_t* layer, void* graphics_ctx, void* layer_ctx)
{
	ugui_menu_widget_t* menu_widget = (ugui_menu_widget_t*) layer_ctx;
	ugui_rect_t* bounds = ugui_layer_get_bounds(layer);

	int32_t num_rows = menu_widget->data_callbacks.get_num_rows(menu_widget, menu_widget->data);
	int32_t header_height = menu_widget->draw_callbacks.get_header_height(menu_widget, menu_widget->data);
	int32_t row_height = menu_widget->draw_callbacks.get_cell_height(menu_widget, menu_widget->data);

	int32_t max_rows = (bounds->h - header_height) / row_height;
	int32_t min_rows = (num_rows < max_rows) ? num_rows : max_rows;

	ugui_rect_t cell_bounds;
	cell_bounds.x = 0;
	cell_bounds.y = header_height;
	cell_bounds.w = bounds->w;
	cell_bounds.h = row_height;

	char header[64];
	char title[64];
	char data[64];

	//Draw header
	menu_widget->data_callbacks.get_header(menu_widget, header);
	menu_widget->draw_callbacks.draw_header(graphics_ctx, bounds, header);

	//Draw cells
	//TODO: support for 2d cells
	for (uint8_t i = 0; i < min_rows; i++) {
		//Calculate row offset in pixels
		cell_bounds.y = header_height + i * row_height;

		menu_widget->data_callbacks.get_data(menu_widget, i + menu_widget->offset, title, data);
		menu_widget->draw_callbacks.draw_row(graphics_ctx, &cell_bounds, title, data);

		//Highlight selected cell
		if ((i + menu_widget->offset) == menu_widget->selected) {
			ugui_graphics_inverse_rect(graphics_ctx,
			(ugui_point_t) {.x = cell_bounds.x, .y = cell_bounds.y},
			(ugui_size_t) {.w = cell_bounds.w, .h = cell_bounds.h});
		}
	}
}